

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsondocument.cpp
# Opt level: O3

void __thiscall QJsonDocument::setObject(QJsonDocument *this,QJsonObject *object)

{
  _Head_base<0UL,_QJsonDocumentPrivate_*,_false> _Var1;
  long in_FS_OFFSET;
  QJsonValue local_50;
  QCborValue local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->d)._M_t.
      super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>._M_t.
      super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
      super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl ==
      (QJsonDocumentPrivate *)0x0) {
    _Var1._M_head_impl = (QJsonDocumentPrivate *)operator_new(0x18);
    ((_Var1._M_head_impl)->value).n = 0;
    *(QCborContainerPrivate **)((long)&(_Var1._M_head_impl)->value + 8) =
         (QCborContainerPrivate *)0x0;
    *(undefined8 *)((long)&(_Var1._M_head_impl)->value + 0x10) = 0;
    *(Type *)((long)&(_Var1._M_head_impl)->value + 0x10) = Undefined;
    (this->d)._M_t.
    super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>._M_t.
    super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
    super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl = _Var1._M_head_impl;
  }
  QJsonValue::QJsonValue(&local_50,object);
  QCborValue::fromJsonValue(&local_38,&local_50);
  QCborValue::operator=
            (&((this->d)._M_t.
               super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>
               ._M_t.
               super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>
               .super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl)->value,&local_38)
  ;
  if (local_38.container != (QCborContainerPrivate *)0x0) {
    QCborValue::dispose(&local_38);
  }
  QJsonValue::~QJsonValue(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QJsonDocument::setObject(const QJsonObject &object)
{
    if (!d)
        d = std::make_unique<QJsonDocumentPrivate>();

    d->value = QCborValue::fromJsonValue(object);
}